

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

string_view __thiscall
RenX_ServerListPlugin::getListServerAddress(RenX_ServerListPlugin *this,Server *server)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long lVar4;
  string_view sVar5;
  
  puVar3 = (undefined8 *)RenX::Server::getSocketHostname_abi_cxx11_();
  pcVar1 = (char *)*puVar3;
  sVar2 = puVar3[1];
  sVar5._M_str = pcVar1;
  sVar5._M_len = sVar2;
  lVar4 = Jupiter::Config::getSection(&this->field_0x38,sVar2,pcVar1);
  if (lVar4 != 0) {
    sVar5 = (string_view)Jupiter::Config::get(lVar4,0xb,"ListAddress",sVar2,pcVar1);
  }
  return sVar5;
}

Assistant:

std::string_view RenX_ServerListPlugin::getListServerAddress(const RenX::Server& server) {
	std::string_view serverHostname;
	serverHostname = server.getSocketHostname();

	if (auto section = config.getSection(serverHostname)) {
		serverHostname = section->get("ListAddress"sv, serverHostname);
	}

	return serverHostname;
}